

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  ulong *puVar1;
  bool bVar2;
  int iVar3;
  sqlite3 *psVar4;
  WhereClause *in_RDX;
  Parse *in_RSI;
  undefined8 *in_RDI;
  bool bVar5;
  int *unaff_retaddr;
  Bitmask mThis;
  Bitmask mNext;
  int i;
  Bitmask mBestNoIn;
  Bitmask mPrev;
  int seenZeroNoIN;
  int seenZero;
  u16 mNoOmit;
  Bitmask mBest;
  WhereLoop *pNew;
  int bIn;
  int nConstraint;
  sqlite3_index_info *p;
  SrcList_item *pSrc;
  WhereClause *pWC;
  Parse *pParse;
  WhereInfo *pWInfo;
  int rc;
  void *in_stack_ffffffffffffff58;
  int *p_00;
  sqlite3 *in_stack_ffffffffffffff60;
  sqlite3 *in_stack_ffffffffffffff68;
  sqlite3 *psVar6;
  int local_8c;
  sqlite3 *local_88;
  sqlite3 *local_80;
  int local_58;
  int local_54;
  sqlite3_index_info *local_50;
  char *local_48;
  u16 *pmNoOmit;
  u16 mNoOmit_00;
  Schema *pIdxInfo;
  SrcList_item *pSrc_00;
  u16 mExclude;
  uint in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  int local_4;
  
  uVar7 = 0;
  pSrc_00 = (SrcList_item *)*in_RDI;
  pIdxInfo = pSrc_00->pSchema;
  pmNoOmit = (u16 *)in_RDI[1];
  puVar1 = (ulong *)in_RDI[3];
  local_48 = pSrc_00->zDatabase + (ulong)(byte)puVar1[2] * 0x70 + 8;
  local_50 = allocateIndexInfo(in_RSI,in_RDX,(ulong)in_stack_ffffffffffffffd8,pSrc_00,
                               (ExprList *)pIdxInfo,pmNoOmit);
  if (local_50 == (sqlite3_index_info *)0x0) {
    local_4 = 7;
  }
  else {
    *(undefined2 *)((long)puVar1 + 0x12) = 0;
    *(undefined4 *)(puVar1 + 5) = 0x400;
    *(undefined2 *)((long)puVar1 + 0x2c) = 0;
    *(undefined1 *)((long)puVar1 + 0x1c) = 0;
    local_54 = local_50->nConstraint;
    iVar3 = whereLoopResize(in_stack_ffffffffffffff68,(WhereLoop *)in_stack_ffffffffffffff60,
                            (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    if (iVar3 == 0) {
      p_00 = &local_58;
      local_4 = whereLoopAddVirtualOne
                          ((WhereLoopBuilder *)in_RSI,(Bitmask)in_RDX,
                           CONCAT44(uVar7,in_stack_ffffffffffffffd8),(u16)((ulong)pSrc_00 >> 0x30),
                           (sqlite3_index_info *)pIdxInfo,(u16)((ulong)pmNoOmit >> 0x30),
                           unaff_retaddr);
      if ((local_4 == 0) &&
         (psVar4 = (sqlite3 *)(*puVar1 & ((ulong)in_RSI ^ 0xffffffffffffffff)),
         psVar4 != (sqlite3 *)0x0)) {
        bVar5 = false;
        local_80 = (sqlite3 *)0x0;
        local_88 = (sqlite3 *)0x0;
        bVar2 = bVar5;
        if (local_58 != 0) {
          p_00 = &local_58;
          local_4 = whereLoopAddVirtualOne
                              ((WhereLoopBuilder *)in_RSI,(Bitmask)in_RDX,
                               (ulong)in_stack_ffffffffffffffd8,(u16)((ulong)pSrc_00 >> 0x30),
                               (sqlite3_index_info *)pIdxInfo,(u16)((ulong)pmNoOmit >> 0x30),
                               unaff_retaddr);
          local_88 = (sqlite3 *)(*puVar1 & ((ulong)in_RSI ^ 0xffffffffffffffff));
          bVar5 = local_88 == (sqlite3 *)0x0;
          bVar2 = bVar5;
        }
        while( true ) {
          mNoOmit_00 = (u16)((ulong)pmNoOmit >> 0x30);
          mExclude = (u16)((ulong)pSrc_00 >> 0x30);
          if (local_4 != 0) break;
          psVar6 = (sqlite3 *)0xffffffffffffffff;
          for (local_8c = 0; local_8c < local_54; local_8c = local_8c + 1) {
            in_stack_ffffffffffffff60 =
                 (sqlite3 *)
                 (*(ulong *)(*(long *)(pmNoOmit + 0x10) +
                             (long)local_50->aConstraint[local_8c].iTermOffset * 0x40 + 0x30) &
                 ((ulong)in_RSI ^ 0xffffffffffffffff));
            if ((local_80 < in_stack_ffffffffffffff60) && (in_stack_ffffffffffffff60 < psVar6)) {
              psVar6 = in_stack_ffffffffffffff60;
            }
          }
          if (psVar6 == (sqlite3 *)0xffffffffffffffff) break;
          local_80 = psVar6;
          if ((psVar6 != psVar4) && (psVar6 != local_88)) {
            p_00 = &local_58;
            local_4 = whereLoopAddVirtualOne
                                ((WhereLoopBuilder *)in_RSI,(Bitmask)in_RDX,
                                 (ulong)in_stack_ffffffffffffffd8,mExclude,
                                 (sqlite3_index_info *)pIdxInfo,mNoOmit_00,unaff_retaddr);
            if (((Parse *)*puVar1 == in_RSI) && (bVar5 = true, local_58 == 0)) {
              bVar2 = true;
            }
          }
        }
        if ((local_4 == 0) && (!bVar5)) {
          p_00 = &local_58;
          local_4 = whereLoopAddVirtualOne
                              ((WhereLoopBuilder *)in_RSI,(Bitmask)in_RDX,
                               (ulong)in_stack_ffffffffffffffd8,mExclude,
                               (sqlite3_index_info *)pIdxInfo,mNoOmit_00,unaff_retaddr);
          if (local_58 == 0) {
            bVar2 = true;
          }
        }
        if ((local_4 == 0) && (!bVar2)) {
          p_00 = &local_58;
          local_4 = whereLoopAddVirtualOne
                              ((WhereLoopBuilder *)in_RSI,(Bitmask)in_RDX,
                               (ulong)in_stack_ffffffffffffffd8,mExclude,
                               (sqlite3_index_info *)pIdxInfo,(u16)((ulong)pmNoOmit >> 0x30),
                               unaff_retaddr);
        }
      }
      if (local_50->needToFreeIdxStr != 0) {
        sqlite3_free((void *)0x1c4665);
      }
      sqlite3DbFreeNN(in_stack_ffffffffffffff60,p_00);
    }
    else {
      sqlite3DbFree(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_4 = 7;
    }
  }
  return local_4;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0),
  ** then there is no point in making any further calls to xBestIndex() 
  ** since they will all return the same result (if the xBestIndex()
  ** implementation is sane). */
  if( rc==SQLITE_OK && (mBest = (pNew->prereq & ~mPrereq))!=0 ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}